

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

CESkyCoord * __thiscall
CESkyCoord::ConvertToEcliptic
          (CESkyCoord *__return_storage_ptr__,CESkyCoord *this,CEDate *date,CEObserver *observer)

{
  CESkyCoord(__return_storage_ptr__);
  switch(this->coord_type_) {
  case CIRS:
    CIRS2Ecliptic(this,__return_storage_ptr__,date);
    break;
  case ICRS:
    ICRS2Ecliptic(this,__return_storage_ptr__,date);
    break;
  case GALACTIC:
    Galactic2Ecliptic(this,__return_storage_ptr__,date);
    break;
  case OBSERVED:
    Observed2Ecliptic(this,__return_storage_ptr__,date,observer);
    break;
  case ECLIPTIC:
    SetCoordinates(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

CESkyCoord CESkyCoord::ConvertToEcliptic(const CEDate&     date,
                                         const CEObserver& observer)
{
    // Create return coordinates
    CESkyCoord ecliptic;

    // Convert
    if (coord_type_ == CESkyCoordType::CIRS) {
        // CIRS -> ECLIPTIC
        CIRS2Ecliptic(*this, &ecliptic, date);
    } else if (coord_type_ == CESkyCoordType::ICRS) {
        // ICRS -> ECLIPTIC
        ICRS2Ecliptic(*this, &ecliptic, date);
    } else if (coord_type_ == CESkyCoordType::GALACTIC) {
        // GALACTIC -> ECLIPTIC
        Galactic2Ecliptic(*this, &ecliptic, date);
    } else if (coord_type_ == CESkyCoordType::OBSERVED) {
        // OBSERVED -> ECLIPTIC
        Observed2Ecliptic(*this, &ecliptic, date, observer);
    } else if (coord_type_ == CESkyCoordType::ECLIPTIC) {
        // ECLIPTIC -> ECLIPTIC
        ecliptic.SetCoordinates(*this);
    }
    
    return ecliptic;
}